

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

CURLcode mqtt_get_topic(Curl_easy *data,char **topic,size_t *topiclen)

{
  CURLcode CVar1;
  size_t sVar2;
  char *pcVar3;
  
  pcVar3 = (data->state).up.path;
  sVar2 = strlen(pcVar3);
  if (sVar2 < 2) {
    pcVar3 = "No MQTT topic found. Forgot to URL encode it?";
  }
  else {
    CVar1 = Curl_urldecode(pcVar3 + 1,0,topic,topiclen,REJECT_NADA);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if (*topiclen < 0x10000) {
      return CURLE_OK;
    }
    pcVar3 = "Too long MQTT topic";
  }
  Curl_failf(data,pcVar3);
  return CURLE_URL_MALFORMAT;
}

Assistant:

static CURLcode mqtt_get_topic(struct Curl_easy *data,
                               char **topic, size_t *topiclen)
{
  char *path = data->state.up.path;
  CURLcode result = CURLE_URL_MALFORMAT;
  if(strlen(path) > 1) {
    result = Curl_urldecode(path + 1, 0, topic, topiclen, REJECT_NADA);
    if(!result && (*topiclen > 0xffff)) {
      failf(data, "Too long MQTT topic");
      result = CURLE_URL_MALFORMAT;
    }
  }
  else
    failf(data, "No MQTT topic found. Forgot to URL encode it?");

  return result;
}